

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O2

void __thiscall
brotli::ZopfliCostModel::SetFromCommands
          (ZopfliCostModel *this,size_t num_bytes,size_t position,uint8_t *ringbuffer,
          size_t ringbuffer_mask,Command *commands,size_t num_commands,size_t last_insert_len)

{
  int *piVar1;
  double dVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  pointer pdVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  vector<double,_std::allocator<double>_> cost_literal;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram_cmd;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram_literal;
  allocator_type local_a1;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  _Vector_base<double,_std::allocator<double>_> local_88;
  size_t local_70;
  size_t local_68;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_60._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,0x100,
             (value_type_conflict *)&local_60,(allocator_type *)&local_a0);
  local_a0._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,0x2c0,
             (value_type_conflict *)&local_a0,(allocator_type *)&local_88);
  local_88._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_88._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  local_68 = num_bytes;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0,0x208,
             (value_type_conflict *)&local_88,&local_a1);
  uVar13 = position - last_insert_len;
  for (sVar11 = 0; sVar11 != num_commands; sVar11 = sVar11 + 1) {
    uVar14 = (ulong)commands[sVar11].insert_len_;
    uVar5 = commands[sVar11].copy_len_;
    uVar3 = commands[sVar11].dist_prefix_;
    uVar4 = commands[sVar11].cmd_prefix_;
    piVar1 = (int *)(CONCAT44(local_60._M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_60._M_impl.super__Vector_impl_data._M_start._0_4_) +
                    (ulong)uVar4 * 4);
    *piVar1 = *piVar1 + 1;
    uVar8 = uVar13;
    uVar12 = uVar14;
    if (0x7f < uVar4) {
      piVar1 = (int *)(CONCAT44(local_a0._M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_a0._M_impl.super__Vector_impl_data._M_start._0_4_) +
                      (ulong)uVar3 * 4);
      *piVar1 = *piVar1 + 1;
    }
    while (uVar12 != 0) {
      local_48._M_impl.super__Vector_impl_data._M_start[ringbuffer[uVar8 & ringbuffer_mask]] =
           local_48._M_impl.super__Vector_impl_data._M_start[ringbuffer[uVar8 & ringbuffer_mask]] +
           1;
      uVar8 = uVar8 + 1;
      uVar12 = uVar12 - 1;
    }
    uVar13 = uVar13 + uVar14 + (ulong)uVar5;
  }
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = position;
  Set(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
      (vector<double,_std::allocator<double>_> *)&local_88);
  sVar7 = local_68;
  sVar11 = local_70;
  Set(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,&this->cost_cmd_);
  Set(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0,&this->cost_dist_);
  pdVar6 = (this->cost_cmd_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar15 = this->min_cost_cmd_;
  for (lVar9 = 0; lVar9 != 0x2c0; lVar9 = lVar9 + 1) {
    dVar2 = pdVar6[lVar9];
    if (dVar15 <= dVar2) {
      dVar2 = dVar15;
    }
    dVar15 = dVar2;
    this->min_cost_cmd_ = dVar15;
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->literal_costs_,sVar7 + 1);
  pdVar6 = (this->literal_costs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar6 = 0.0;
  dVar15 = 0.0;
  for (sVar10 = 0; sVar7 != sVar10; sVar10 = sVar10 + 1) {
    dVar15 = dVar15 + local_88._M_impl.super__Vector_impl_data._M_start
                      [ringbuffer[sVar11 + sVar10 & ringbuffer_mask]];
    pdVar6[sVar10 + 1] = dVar15;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_a0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void SetFromCommands(size_t num_bytes,
                       size_t position,
                       const uint8_t* ringbuffer,
                       size_t ringbuffer_mask,
                       const Command* commands,
                       size_t num_commands,
                       size_t last_insert_len) {
    std::vector<uint32_t> histogram_literal(256, 0);
    std::vector<uint32_t> histogram_cmd(kNumCommandPrefixes, 0);
    std::vector<uint32_t> histogram_dist(kNumDistancePrefixes, 0);

    size_t pos = position - last_insert_len;
    for (size_t i = 0; i < num_commands; i++) {
      size_t inslength = commands[i].insert_len_;
      size_t copylength = commands[i].copy_len_;
      size_t distcode = commands[i].dist_prefix_;
      size_t cmdcode = commands[i].cmd_prefix_;

      histogram_cmd[cmdcode]++;
      if (cmdcode >= 128) histogram_dist[distcode]++;

      for (size_t j = 0; j < inslength; j++) {
        histogram_literal[ringbuffer[(pos + j) & ringbuffer_mask]]++;
      }

      pos += inslength + copylength;
    }

    std::vector<double> cost_literal;
    Set(histogram_literal, &cost_literal);
    Set(histogram_cmd, &cost_cmd_);
    Set(histogram_dist, &cost_dist_);

    for (uint32_t i = 0; i < kNumCommandPrefixes; ++i) {
      min_cost_cmd_ = std::min(min_cost_cmd_, cost_cmd_[i]);
    }

    literal_costs_.resize(num_bytes + 1);
    literal_costs_[0] = 0.0;
    for (size_t i = 0; i < num_bytes; ++i) {
      literal_costs_[i + 1] = literal_costs_[i] +
          cost_literal[ringbuffer[(position + i) & ringbuffer_mask]];
    }
  }